

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FinalStmtBlock *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  ulong uVar5;
  string_view sVar6;
  string local_58;
  char local_31;
  
  if ((stmt->super_StmtBlock).super_Stmt.super_IRNode.comment._M_string_length != 0) {
    sVar6 = indent(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar6._M_str,
                        sVar6._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"// ",3);
    strip_newline(&local_58,&(stmt->super_StmtBlock).super_Stmt.super_IRNode.comment);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->generator_->debug == true) {
    (stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"final begin",0xb);
  block_label_abi_cxx11_(&local_58,this,&stmt->super_StmtBlock);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this->indent_ = this->indent_ + 1;
  if ((stmt->super_StmtBlock).stmts_.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (stmt->super_StmtBlock).stmts_.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      iVar3 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])(stmt,uVar5);
      (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var,iVar3));
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(stmt->super_StmtBlock).stmts_.
                                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(stmt->super_StmtBlock).stmts_.
                                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  this->indent_ = this->indent_ - 1;
  sVar6 = indent(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"end",3);
  block_label_abi_cxx11_(&local_58,this,&stmt->super_StmtBlock);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FinalStmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }

    stream_ << "final begin" << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}